

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall
TPZAnalysis::SetStructuralMatrix(TPZAnalysis *this,TPZAutoPointer<TPZStructMatrix> *strmatrix)

{
  TPZStructMatrix *pTVar1;
  long lVar2;
  TPZStructMatrix *in_RSI;
  TPZAutoPointer<TPZStructMatrix> *in_RDI;
  TPZStructMatrixT<double> *tmp;
  TPZAutoPointer<TPZStructMatrix> *in_stack_ffffffffffffff98;
  TPZAutoPointer<TPZStructMatrix> *in_stack_ffffffffffffffa0;
  
  pTVar1 = TPZAutoPointer<TPZStructMatrix>::operator->((TPZAutoPointer<TPZStructMatrix> *)in_RSI);
  (**(code **)(*(long *)pTVar1 + 0x48))();
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer(in_RDI,in_RSI);
  TPZAutoPointer<TPZStructMatrix>::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(in_stack_ffffffffffffffa0);
  pTVar1 = TPZAutoPointer<TPZStructMatrix>::operator->((TPZAutoPointer<TPZStructMatrix> *)in_RSI);
  if (pTVar1 == (TPZStructMatrix *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(pTVar1,&::TPZStructMatrix::typeinfo,&TPZStructMatrixT<double>::typeinfo,0
                          );
  }
  if (lVar2 == 0) {
    if (in_RDI[2].fRef != (TPZReference *)0x0) {
      TPZCompMesh::GetSolType((TPZCompMesh *)in_RDI[2].fRef);
    }
  }
  else if (in_RDI[2].fRef != (TPZReference *)0x0) {
    TPZCompMesh::GetSolType((TPZCompMesh *)in_RDI[2].fRef);
  }
  return;
}

Assistant:

void TPZAnalysis::SetStructuralMatrix(TPZAutoPointer<TPZStructMatrix> strmatrix){
	fStructMatrix = TPZAutoPointer<TPZStructMatrix>(strmatrix->Clone());
// #ifdef PZDEBUG
    auto* tmp =
        dynamic_cast<TPZStructMatrixT<STATE> *>((strmatrix.operator->()));
    if(tmp){//real struct matrix
        if(fCompMesh && fCompMesh->GetSolType() == EReal){
            return;
        }
    }else{//complex struct matrix
        if(fCompMesh && fCompMesh->GetSolType() == EComplex){
            return;
        }
    }
// #endif
}